

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  _Head_base<0UL,_int_*,_false> *p_Var1;
  uint32_t uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  InstOp IVar9;
  EmptyOp EVar10;
  uchar *puVar11;
  int *piVar12;
  iterator piVar13;
  InstCond *pIVar14;
  ostream *poVar15;
  ostream *this_00;
  uchar *__src;
  PODArray<unsigned_char> local_318;
  EmptyOp local_308;
  EmptyOp local_304;
  uint32_t newact_1;
  uint32_t act_1;
  int b_2;
  int c_1;
  int local_2f0;
  int local_2ec;
  Rune hi;
  uint32_t local_2e4;
  EmptyOp local_2e0;
  Rune lo;
  uint32_t newact;
  uint32_t act;
  int b_1;
  int c;
  value_type_conflict3 local_2c1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  const_iterator local_2b8;
  int local_2ac;
  undefined1 local_2a8 [4];
  int nextindex;
  Inst *local_128;
  Inst *ip;
  int local_118;
  uint32_t cond;
  int id_1;
  int nstack;
  bool matched;
  OneState *pOStack_108;
  int b;
  OneState *node;
  int nodeindex;
  int id;
  iterator it;
  value_type_conflict3 local_e1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  const_iterator local_d8;
  int local_cc;
  undefined1 local_c8 [4];
  int nalloc;
  Instq workq;
  Instq tovisit;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  PODArray<int> nodebyid;
  undefined1 local_38 [4];
  int size;
  PODArray<re2::InstCond> stack;
  int stacksize;
  int statesize;
  int maxnodes;
  Prog *this_local;
  
  if ((this->did_onepass_ & 1U) == 0) {
    this->did_onepass_ = true;
    iVar4 = start(this);
    if (iVar4 == 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar4 = inst_count(this,kInstByteRange);
      iVar4 = iVar4 + 2;
      iVar5 = bytemap_range(this);
      iVar5 = iVar5 * 4 + 4;
      if ((iVar4 < 65000) && ((long)iVar4 <= (this->dfa_mem_ / 4) / (long)iVar5)) {
        iVar6 = inst_count(this,kInstCapture);
        iVar7 = inst_count(this,kInstEmptyWidth);
        iVar8 = inst_count(this,kInstNop);
        stack.ptr_._M_t.super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
        super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl._4_4_ = iVar8 + 1 + iVar6 + iVar7
        ;
        PODArray<re2::InstCond>::PODArray
                  ((PODArray<re2::InstCond> *)local_38,
                   stack.ptr_._M_t.
                   super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
                   super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl._4_4_);
        iVar6 = Prog::size(this);
        PODArray<int>::PODArray
                  ((PODArray<int> *)
                   &nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,iVar6);
        piVar12 = PODArray<int>::data((PODArray<int> *)
                                      &nodes.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memset(piVar12,0xff,(long)iVar6 << 2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&tovisit.dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8));
        SparseSetT<void>::SparseSetT
                  ((SparseSetT<void> *)
                   ((long)&workq.dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8),iVar6);
        SparseSetT<void>::SparseSetT((SparseSetT<void> *)local_c8,iVar6);
        iVar6 = start(this);
        AddQ((Instq *)((long)&workq.dense_.ptr_._M_t.
                              super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                              super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8),iVar6)
        ;
        iVar6 = start(this);
        piVar12 = PODArray<int>::operator[]
                            ((PODArray<int> *)
                             &nodes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar6);
        *piVar12 = 0;
        local_cc = 1;
        p_Var1 = (_Head_base<0UL,_int_*,_false> *)
                 ((long)&tovisit.dense_.ptr_._M_t.
                         super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8);
        local_e0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var1);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_d8,&local_e0);
        local_e1 = '\0';
        it = (iterator)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var1,local_d8,
                        (long)iVar5,&local_e1);
        for (_nodeindex = SparseSetT<void>::begin
                                    ((SparseSetT<void> *)
                                     ((long)&workq.dense_.ptr_._M_t.
                                             super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>
                                     + 8)); piVar12 = _nodeindex,
            piVar13 = SparseSetT<void>::end
                                ((SparseSetT<void> *)
                                 ((long)&workq.dense_.ptr_._M_t.
                                         super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>
                                 + 8)), piVar12 != piVar13; _nodeindex = _nodeindex + 1) {
          node._4_4_ = *_nodeindex;
          piVar12 = PODArray<int>::operator[]
                              ((PODArray<int> *)
                               &nodes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,node._4_4_);
          node._0_4_ = *piVar12;
          puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&tovisit.dense_.ptr_._M_t.
                                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> +
                               8));
          pOStack_108 = IndexToNode(puVar11,iVar5,(int)node);
          for (nstack = 0; nstack < this->bytemap_range_; nstack = nstack + 1) {
            pOStack_108[(long)nstack + 1].matchcond = 0x30;
          }
          pOStack_108->matchcond = 0x30;
          SparseSetT<void>::clear((SparseSetT<void> *)local_c8);
          iVar6 = node._4_4_;
          id_1._3_1_ = 0;
          cond = 0;
          pIVar14 = PODArray<re2::InstCond>::operator[]((PODArray<re2::InstCond> *)local_38,0);
          uVar2 = cond;
          pIVar14->id = iVar6;
          cond = cond + 1;
          pIVar14 = PODArray<re2::InstCond>::operator[]((PODArray<re2::InstCond> *)local_38,uVar2);
          pIVar14->cond = 0;
LAB_00363313:
          if (0 < (int)cond) {
            cond = cond - 1;
            pIVar14 = PODArray<re2::InstCond>::operator[]((PODArray<re2::InstCond> *)local_38,cond);
            local_118 = pIVar14->id;
            pIVar14 = PODArray<re2::InstCond>::operator[]((PODArray<re2::InstCond> *)local_38,cond);
            ip._4_4_ = pIVar14->cond;
LAB_00363377:
            local_128 = inst(this,local_118);
            IVar9 = Inst::opcode(local_128);
            switch(IVar9) {
            case kInstAltMatch:
              iVar6 = Inst::last(local_128);
              if (iVar6 != 0) {
                __assert_fail("!ip->last()",
                              "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/onepass.cc"
                              ,0x1c5,"bool re2::Prog::IsOnePass()");
              }
              bVar3 = AddQ((Instq *)local_c8,local_118 + 1);
              if (bVar3) {
                local_118 = local_118 + 1;
                goto LAB_00363377;
              }
              break;
            case kInstByteRange:
              iVar6 = Inst::out(local_128);
              piVar12 = PODArray<int>::operator[]
                                  ((PODArray<int> *)
                                   &nodes.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar6);
              local_2ac = *piVar12;
              if (local_2ac == -1) {
                if (iVar4 <= local_cc) break;
                local_2ac = local_cc;
                iVar6 = Inst::out(local_128);
                AddQ((Instq *)((long)&workq.dense_.ptr_._M_t.
                                      super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8
                              ),iVar6);
                iVar6 = local_cc;
                iVar7 = Inst::out(local_128);
                piVar12 = PODArray<int>::operator[]
                                    ((PODArray<int> *)
                                     &nodes.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar7);
                *piVar12 = iVar6;
                local_cc = local_cc + 1;
                p_Var1 = (_Head_base<0UL,_int_*,_false> *)
                         ((long)&tovisit.dense_.ptr_._M_t.
                                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8);
                local_2c0._M_current =
                     (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         p_Var1);
                __gnu_cxx::
                __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::__normal_iterator<unsigned_char*>
                          ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)&local_2b8,&local_2c0);
                local_2c1 = '\0';
                _b_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var1,
                                  local_2b8,(long)iVar5,&local_2c1);
                puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)&tovisit.dense_.ptr_._M_t.
                                             super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>
                                     + 8));
                pOStack_108 = IndexToNode(puVar11,iVar5,(int)node);
              }
              for (act = Inst::lo(local_128); uVar2 = act, iVar6 = Inst::hi(local_128),
                  (int)uVar2 <= iVar6; act = act + 1) {
                newact = (uint32_t)this->bytemap_[(int)act];
                while( true ) {
                  bVar3 = false;
                  if ((int)act < 0xff) {
                    bVar3 = this->bytemap_[(int)(act + 1)] == newact;
                  }
                  if (!bVar3) break;
                  act = act + 1;
                }
                lo = pOStack_108[(long)(int)newact + 1].matchcond;
                local_2e0 = local_2ac << 0x10 | ip._4_4_;
                if ((id_1._3_1_ & 1) != 0) {
                  local_2e0 = local_2e0 | 0x40;
                }
                if ((lo & (kEmptyNonWordBoundary|kEmptyWordBoundary)) ==
                    (kEmptyNonWordBoundary|kEmptyWordBoundary)) {
                  pOStack_108[(long)(int)newact + 1].matchcond = local_2e0;
                }
                else if (lo != local_2e0) goto LAB_00363d80;
              }
              iVar6 = Inst::foldcase(local_128);
              if (iVar6 != 0) {
                hi = Inst::lo(local_128);
                local_2ec = 0x61;
                piVar12 = CLI::std::max<int>(&hi,&local_2ec);
                local_2e4 = *piVar12 - 0x20;
                c_1 = Inst::hi(local_128);
                b_2 = 0x7a;
                piVar12 = CLI::std::min<int>(&c_1,&b_2);
                local_2f0 = *piVar12 + -0x20;
                for (act_1 = local_2e4; (int)act_1 <= local_2f0; act_1 = act_1 + 1) {
                  newact_1 = (uint32_t)this->bytemap_[(int)act_1];
                  while( true ) {
                    bVar3 = false;
                    if ((int)act_1 < 0xff) {
                      bVar3 = this->bytemap_[(int)(act_1 + 1)] == newact_1;
                    }
                    if (!bVar3) break;
                    act_1 = act_1 + 1;
                  }
                  local_304 = pOStack_108[(long)(int)newact_1 + 1].matchcond;
                  local_308 = local_2ac << 0x10 | ip._4_4_;
                  if ((id_1._3_1_ & 1) != 0) {
                    local_308 = local_308 | 0x40;
                  }
                  if ((local_304 & (kEmptyNonWordBoundary|kEmptyWordBoundary)) ==
                      (kEmptyNonWordBoundary|kEmptyWordBoundary)) {
                    pOStack_108[(long)(int)newact_1 + 1].matchcond = local_308;
                  }
                  else if (local_304 != local_308) goto LAB_00363d80;
                }
              }
              iVar6 = Inst::last(local_128);
              if (iVar6 != 0) goto LAB_00363313;
              bVar3 = AddQ((Instq *)local_c8,local_118 + 1);
              if (bVar3) {
                local_118 = local_118 + 1;
                goto LAB_00363377;
              }
              break;
            case kInstCapture:
            case kInstEmptyWidth:
            case kInstNop:
              iVar6 = Inst::last(local_128);
              if (iVar6 == 0) {
                bVar3 = AddQ((Instq *)local_c8,local_118 + 1);
                if (!bVar3) break;
                iVar6 = local_118 + 1;
                pIVar14 = PODArray<re2::InstCond>::operator[]
                                    ((PODArray<re2::InstCond> *)local_38,cond);
                uVar2 = cond;
                EVar10 = ip._4_4_;
                pIVar14->id = iVar6;
                cond = cond + 1;
                pIVar14 = PODArray<re2::InstCond>::operator[]
                                    ((PODArray<re2::InstCond> *)local_38,uVar2);
                pIVar14->cond = EVar10;
              }
              IVar9 = Inst::opcode(local_128);
              if ((IVar9 == kInstCapture) && (iVar6 = Inst::cap(local_128), iVar6 < 10)) {
                iVar6 = Inst::cap(local_128);
                ip._4_4_ = 0x20 << ((byte)iVar6 & 0x1f) | ip._4_4_;
              }
              IVar9 = Inst::opcode(local_128);
              if (IVar9 == kInstEmptyWidth) {
                EVar10 = Inst::empty(local_128);
                ip._4_4_ = EVar10 | ip._4_4_;
              }
              iVar6 = Inst::out(local_128);
              bVar3 = AddQ((Instq *)local_c8,iVar6);
              if (bVar3) {
                local_118 = Inst::out(local_128);
                goto LAB_00363377;
              }
              break;
            case kInstMatch:
              if ((id_1._3_1_ & 1) != 0) break;
              id_1._3_1_ = 1;
              pOStack_108->matchcond = ip._4_4_;
              iVar6 = Inst::last(local_128);
              if (iVar6 != 0) goto LAB_00363313;
              bVar3 = AddQ((Instq *)local_c8,local_118 + 1);
              if (!bVar3) break;
              local_118 = local_118 + 1;
              goto LAB_00363377;
            case kInstFail:
              goto switchD_003633df_caseD_7;
            default:
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_2a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/onepass.cc"
                         ,0x1bf);
              poVar15 = LogMessage::stream((LogMessage *)local_2a8);
              this_00 = std::operator<<((ostream *)poVar15,"unhandled opcode: ");
              IVar9 = Inst::opcode(local_128);
              std::ostream::operator<<(this_00,IVar9);
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_2a8);
            }
LAB_00363d80:
            this_local._7_1_ = false;
            goto LAB_00363d8e;
          }
        }
        this->dfa_mem_ = this->dfa_mem_ - (long)(local_cc * iVar5);
        PODArray<unsigned_char>::PODArray(&local_318,local_cc * iVar5);
        PODArray<unsigned_char>::operator=(&this->onepass_nodes_,&local_318);
        PODArray<unsigned_char>::~PODArray(&local_318);
        puVar11 = PODArray<unsigned_char>::data(&this->onepass_nodes_);
        __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&tovisit.dense_.ptr_._M_t.
                                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8));
        memmove(puVar11,__src,(long)(local_cc * iVar5));
        this_local._7_1_ = true;
LAB_00363d8e:
        SparseSetT<void>::~SparseSetT((SparseSetT<void> *)local_c8);
        SparseSetT<void>::~SparseSetT
                  ((SparseSetT<void> *)
                   ((long)&workq.dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&tovisit.dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8));
        PODArray<int>::~PODArray
                  ((PODArray<int> *)
                   &nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        PODArray<re2::InstCond>::~PODArray((PODArray<re2::InstCond> *)local_38);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    puVar11 = PODArray<unsigned_char>::data(&this->onepass_nodes_);
    this_local._7_1_ = puVar11 != (uchar *)0x0;
  }
  return this_local._7_1_;
switchD_003633df_caseD_7:
  goto LAB_00363313;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}